

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkReverseTopoOrder(Abc_Ntk_t *p)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  size_t __size;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  if (p->vTopo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTopo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                  ,0xa50,"void Abc_NtkReverseTopoOrder(Abc_Ntk_t *)");
  }
  pVVar5 = p->vObjs;
  iVar6 = pVVar5->nSize;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar6 * 10 - 1U) {
    iVar4 = iVar6 * 10;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar4;
  if (iVar4 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar4 << 2);
  }
  pVVar2->pArray = piVar3;
  p->vTopo = pVVar2;
  uVar10 = (long)iVar6 * 2;
  iVar8 = (int)uVar10;
  if (iVar4 < iVar8) {
    __size = (long)iVar6 << 3;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(piVar3,__size);
    }
    pVVar2->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_001fdda8:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar2->nCap = iVar8;
  }
  if (iVar6 < 1) {
    pVVar2->nSize = iVar8;
  }
  else {
    memset(piVar3,0,(uVar10 & 0xffffffff) << 2);
    uVar1 = pVVar5->nSize;
    uVar7 = (ulong)uVar1;
    pVVar2->nSize = iVar8;
    if (0 < (int)uVar1) {
      lVar9 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar5->pArray[lVar9];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          uVar1 = pObj->Id * 2;
          if (((int)uVar1 < 0) || (pVVar2 = pObj->pNtk->vTopo, pVVar2->nSize <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (pVVar2->pArray[uVar1] == 0) {
            if ((p->vTravIds).pArray == (int *)0x0) {
              piVar3 = (int *)calloc(1,(uVar7 & 0xffffffff) * 4 + 2000);
              (p->vTravIds).pArray = piVar3;
              if (piVar3 == (int *)0x0) goto LAB_001fdda8;
              iVar6 = (int)uVar7 + 500;
              (p->vTravIds).nCap = iVar6;
              (p->vTravIds).nSize = iVar6;
            }
            iVar6 = p->nTravIds;
            p->nTravIds = iVar6 + 1;
            if (0x3ffffffe < iVar6) {
              __assert_fail("p->nTravIds < (1<<30)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                            ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
            }
            Abc_NtkReverseTopoOrder_rec(pObj,1);
            pVVar5 = p->vObjs;
          }
        }
        lVar9 = lVar9 + 1;
        uVar7 = (ulong)pVVar5->nSize;
      } while (lVar9 < (long)uVar7);
      uVar10 = (ulong)(uint)p->vTopo->nSize;
    }
  }
  printf("Nodes = %d.   Size = %d.  Ratio = %f.\n",(double)(int)uVar10 / (double)p->nObjCounts[7],
         (ulong)(uint)p->nObjCounts[7],uVar10 & 0xffffffff);
  return;
}

Assistant:

void Abc_NtkReverseTopoOrder( Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    assert( p->vTopo == NULL );
    p->vTopo = Vec_IntAlloc( 10 * Abc_NtkObjNumMax(p) );
    Vec_IntFill( p->vTopo, 2 * Abc_NtkObjNumMax(p), 0 );
    Abc_NtkForEachNode( p, pObj, i )
    {
        if ( Abc_NtkTopoHasBeg(pObj) )
            continue;
        Abc_NtkIncrementTravId( p );        
        Abc_NtkReverseTopoOrder_rec( pObj, 1 );
    }
    printf( "Nodes = %d.   Size = %d.  Ratio = %f.\n", 
        Abc_NtkNodeNum(p), Vec_IntSize(p->vTopo), 1.0*Vec_IntSize(p->vTopo)/Abc_NtkNodeNum(p) );
}